

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.cpp
# Opt level: O1

bool ReadDSC(MemFile *file,shared_ptr<Disk> *disk)

{
  pointer pcVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  string *psVar6;
  exception *peVar7;
  ssize_t sVar8;
  ssize_t sVar9;
  Header *__nbytes;
  size_t __nbytes_00;
  uint uVar10;
  int iVar11;
  uint sector_00;
  MemFile *this;
  DSC_TRACK dh;
  DSC_SECTOR ds;
  DSC_DATA dd;
  CylHead cylhead;
  Data data;
  int offset;
  Sector sector;
  string strPath;
  Track track;
  MemFile file2;
  byte local_15b;
  byte local_15a;
  byte local_159;
  byte local_158;
  byte local_157;
  byte local_156;
  byte local_155;
  value_type local_154;
  byte local_153;
  byte local_152;
  byte local_151;
  CylHead local_150;
  undefined8 local_148;
  Header local_140;
  long local_130;
  uint local_124;
  shared_ptr<Disk> *local_120;
  undefined1 local_118 [40];
  vector<Data,_std::allocator<Data>_> local_f0;
  string local_d8;
  Track local_b8;
  MemFile local_98;
  
  local_120 = disk;
  MemFile::rewind(file,(FILE *)disk);
  psVar6 = MemFile::path_abi_cxx11_(file);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar1,pcVar1 + psVar6->_M_string_length);
  local_98.m_path._M_dataplus._M_p = (pointer)&local_98.m_path.field_2;
  local_98.m_path._M_string_length = 0;
  local_98.m_path.field_2._M_local_buf[0] = '\0';
  local_98.m_filename._M_dataplus._M_p = (pointer)&local_98.m_filename.field_2;
  local_98.m_filename._M_string_length = 0;
  local_98.m_filename.field_2._M_local_buf[0] = '\0';
  local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.m_it._M_current = (uchar *)0x0;
  local_98.m_compress = None;
  pcVar1 = local_118 + 0x10;
  local_118._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"hdr","");
  bVar3 = IsFileExt(&local_d8,(string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar1) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (bVar3) {
    local_d8._M_dataplus._M_p[local_d8._M_string_length - 3] =
         local_d8._M_dataplus._M_p[local_d8._M_string_length - 3] & 0x20U | 0x44;
    local_d8._M_dataplus._M_p[local_d8._M_string_length - 2] =
         local_d8._M_dataplus._M_p[local_d8._M_string_length - 2] & 0x20U | 0x53;
    local_d8._M_dataplus._M_p[local_d8._M_string_length - 1] =
         local_d8._M_dataplus._M_p[local_d8._M_string_length - 1] & 0x20U | 0x43;
    iVar4 = MemFile::open(&local_98,(char *)&local_d8,1);
    __nbytes_00 = local_d8._M_string_length;
    this = file;
    file = &local_98;
    if ((char)iVar4 == '\0') {
      peVar7 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28]>
                (peVar7,(char (*) [28])"missing .dsc companion file");
      __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    local_118._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"dsc","");
    bVar3 = IsFileExt(&local_d8,(string *)local_118);
    if ((pointer)local_118._0_8_ != pcVar1) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if (!bVar3) {
      bVar3 = false;
      goto LAB_0018be3f;
    }
    local_d8._M_dataplus._M_p[local_d8._M_string_length - 3] =
         local_d8._M_dataplus._M_p[local_d8._M_string_length - 3] & 0x20U | 0x48;
    local_d8._M_dataplus._M_p[local_d8._M_string_length - 2] =
         local_d8._M_dataplus._M_p[local_d8._M_string_length - 2] & 0x20U | 0x44;
    local_d8._M_dataplus._M_p[local_d8._M_string_length - 1] =
         local_d8._M_dataplus._M_p[local_d8._M_string_length - 1] & 0x20U | 0x52;
    this = &local_98;
    iVar4 = MemFile::open(this,(char *)&local_d8,1);
    __nbytes_00 = local_d8._M_string_length;
    if ((char)iVar4 == '\0') {
      peVar7 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28]>
                (peVar7,(char (*) [28])"missing .hdr companion file");
      __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  do {
    sVar8 = MemFile::read(this,(int)&local_15b,(void *)0x2,__nbytes_00);
    if ((char)sVar8 == '\0') break;
    Track::Track(&local_b8,0);
    CylHead::CylHead(&local_150,(uint)(local_15b >> 1),local_15b & 1);
    if (local_15a != 0) {
      sector_00 = 0;
      do {
        sVar9 = MemFile::read(this,(int)&local_159,(void *)0x6,1);
        if ((int)sVar9 == 0) {
          peVar7 = (exception *)__cxa_allocate_exception(0x10);
          local_118._0_8_ = CHS(local_150.cyl,local_150.head,sector_00);
          util::exception::exception<char_const(&)[22],char_const*>
                    (peVar7,(char (*) [22])"short file reading %s",(char **)local_118);
          __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        Header::Header(&local_140,(uint)local_159,(uint)local_158,(uint)local_157,(uint)local_156);
        __nbytes = &local_140;
        Sector::Sector((Sector *)local_118,_250K,MFM,&local_140,0);
        if ((local_155 & 0xfd) != 0) {
          local_148 = (char *)(CONCAT44(local_148._4_4_,(uint)local_155) & 0xffffffff000000fd);
          local_140._0_8_ = CHSR(local_150.cyl,local_150.head,sector_00,(uint)local_157);
          __nbytes = &local_140;
          Message<int,char_const*>
                    (msgWarning,"unknown flags [%02X] for %s",(int *)&local_148,(char **)&local_140)
          ;
        }
        if ((local_155 & 2) == 0) {
          sVar9 = MemFile::read(this,(int)&local_153,(void *)0x3,(size_t)__nbytes);
          if ((char)sVar9 == '\0') {
            peVar7 = (exception *)__cxa_allocate_exception(0x10);
            local_140._0_8_ = CHSR(local_150.cyl,local_150.head,sector_00,local_118._8_4_);
            util::exception::exception<char_const(&)[20],char_const*>
                      (peVar7,(char (*) [20])"short file reading ",(char **)&local_140);
            __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar10 = (uint)local_153 << 8 | (uint)local_152 << 0x10 | (uint)local_151 << 0x18;
          local_124 = uVar10;
          uVar5 = MemFile::tell(file);
          if (uVar10 != uVar5) {
            iVar4 = MemFile::tell(file);
            local_140.cyl = iVar4;
            Message<int&,int>(msgWarning,"header offset (%lu) != data pointer (%lu)",
                              (int *)&local_124,&local_140.cyl);
          }
          iVar4 = Sector::size((Sector *)local_118);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,(long)iVar4
                     ,(allocator_type *)&local_148);
          iVar11 = local_140.sector - local_140.cyl;
          iVar4 = MemFile::remaining(file);
          if (iVar4 < iVar11) {
            peVar7 = (exception *)__cxa_allocate_exception(0x10);
            local_148 = CHSR(local_150.cyl,local_150.head,sector_00,local_118._8_4_);
            util::exception::exception<char_const(&)[27],char_const*>
                      (peVar7,(char (*) [27])"short file reading %s data",(char **)&local_148);
            __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          memcpy((void *)local_140._0_8_,(file->m_it)._M_current,(long)iVar11);
          (file->m_it)._M_current = (file->m_it)._M_current + iVar11;
          __nbytes_00 = 0xfb;
          Sector::add((Sector *)local_118,(Data *)&local_140,false,0xfb);
          if ((char *)local_140._0_8_ != (char *)0x0) {
            operator_delete((void *)local_140._0_8_,local_130 - local_140._0_8_);
          }
        }
        else {
          iVar4 = Sector::size((Sector *)local_118);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,(long)iVar4
                     ,&local_154,(allocator_type *)&local_148);
          __nbytes_00 = 0xfb;
          Sector::add((Sector *)local_118,(Data *)&local_140,false,0xfb);
          if ((char *)local_140._0_8_ != (char *)0x0) {
            operator_delete((void *)local_140._0_8_,local_130 - local_140._0_8_);
          }
        }
        Track::add(&local_b8,(Sector *)local_118);
        std::vector<Data,_std::allocator<Data>_>::~vector(&local_f0);
        sector_00 = sector_00 + 1;
      } while (sector_00 < local_15a);
    }
    Disk::write((local_120->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                (int)&local_150,&local_b8,__nbytes_00);
    std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_b8.m_sectors);
  } while ((char)sVar8 != '\0');
  peVar2 = (local_120->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bVar3 = true;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar2->strType,0,(char *)(peVar2->strType)._M_string_length,0x1b0d4f);
LAB_0018be3f:
  if (local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.m_data.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_data.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_filename._M_dataplus._M_p != &local_98.m_filename.field_2) {
    operator_delete(local_98.m_filename._M_dataplus._M_p,
                    CONCAT71(local_98.m_filename.field_2._M_allocated_capacity._1_7_,
                             local_98.m_filename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_path._M_dataplus._M_p != &local_98.m_path.field_2) {
    operator_delete(local_98.m_path._M_dataplus._M_p,
                    CONCAT71(local_98.m_path.field_2._M_allocated_capacity._1_7_,
                             local_98.m_path.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool ReadDSC(MemFile& file, std::shared_ptr<Disk>& disk)
{
    file.rewind();

    // ToDo: std::string for file extension
    std::string strPath = file.path();
    MemFile file2;
    MemFile* pfileHeader = &file, * pfileData = &file2;

    // If we've been given the header, open the data file
    if (IsFileExt(strPath, "hdr"))
    {
        // HDR->DSC (preserving case)
        size_t offset = strPath.length() - 3;
        strPath[offset + 0] = 'D' | (strPath[offset + 0] & 0x20);
        strPath[offset + 1] = 'S' | (strPath[offset + 1] & 0x20);
        strPath[offset + 2] = 'C' | (strPath[offset + 2] & 0x20);

        if (!file2.open(strPath))
            throw util::exception("missing .dsc companion file");
    }
    // Or if given the data file, switch to the header
    else if (IsFileExt(strPath, "dsc"))
    {
        // DSC->HDR
        size_t offset = strPath.length() - 3;
        strPath[offset + 0] = 'H' | (strPath[offset + 0] & 0x20);
        strPath[offset + 1] = 'D' | (strPath[offset + 1] & 0x20);
        strPath[offset + 2] = 'R' | (strPath[offset + 2] & 0x20);

        if (!file2.open(strPath))
            throw util::exception("missing .hdr companion file");

        std::swap(pfileHeader, pfileData);
    }
    // Reject other file extensions
    else
        return false;

    for (;;)
    {
        DSC_TRACK dh;
        if (!pfileHeader->read(&dh, sizeof(dh)))
            break;

        Track track;
        CylHead cylhead(dh.cyl, dh.head);

        for (int i = 0; i < dh.sectors; ++i)
        {
            DSC_SECTOR ds;
            if (!pfileHeader->read(&ds, sizeof(ds), 1))
                throw util::exception("short file reading %s", CHS(cylhead.cyl, cylhead.head, i));

            Sector sector(DataRate::_250K, Encoding::MFM, Header(ds.cyl, ds.head, ds.sector, ds.size));

            if (ds.flags & ~0x02)
                Message(msgWarning, "unknown flags [%02X] for %s", ds.flags & ~0x02, CHSR(cylhead.cyl, cylhead.head, i, ds.sector));

            // b1 of flags indicates fill byte
            if (ds.flags & 0x02)
                sector.add(Data(sector.size(), ds.fill));
            else
            {
                DSC_DATA dd;
                if (!pfileHeader->read(&dd, sizeof(dd)))
                    throw util::exception("short file reading ", CHSR(cylhead.cyl, cylhead.head, i, sector.header.sector));

                auto offset = (dd.bOff16M << 24) | (dd.bOff64K << 16) | (dd.bOff256 << 8);
                if (offset != pfileData->tell())
                    Message(msgWarning, "header offset (%lu) != data pointer (%lu)", offset, pfileData->tell());

                Data data(sector.size());
                if (!pfileData->read(data))
                    throw util::exception("short file reading %s data", CHSR(cylhead.cyl, cylhead.head, i, sector.header.sector));
                sector.add(std::move(data));
            }

            track.add(std::move(sector));
        }

        disk->write(cylhead, std::move(track));
    }

    disk->strType = "DSC";
    return true;
}